

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

void google::protobuf::util::MatchIndicesPostProcessorForSmartList
               (vector<int,_std::allocator<int>_> *match_list1,
               vector<int,_std::allocator<int>_> *match_list2)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  piVar2 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar7 = 0;
    uVar8 = 0xffffffff;
    do {
      uVar1 = piVar2[lVar7];
      uVar5 = (ulong)(int)uVar1;
      uVar4 = uVar8;
      if ((-1 < (long)uVar5) && (uVar4 = uVar1, uVar1 <= uVar8 && -1 < (int)uVar8)) {
        piVar3 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
        }
        piVar3[uVar5] = -1;
        piVar2[lVar7] = -1;
        uVar4 = uVar8;
      }
      uVar8 = uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return;
}

Assistant:

void MatchIndicesPostProcessorForSmartList(std::vector<int>* match_list1,
                                           std::vector<int>* match_list2) {
  int last_matched_index = -1;
  for (size_t i = 0; i < match_list1->size(); ++i) {
    if (match_list1->at(i) < 0) {
      continue;
    }
    if (last_matched_index < 0 || match_list1->at(i) > last_matched_index) {
      last_matched_index = match_list1->at(i);
    } else {
      match_list2->at(match_list1->at(i)) = -1;
      match_list1->at(i) = -1;
    }
  }
}